

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::InjectJsBuiltInLibraryCode
          (JsBuiltInEngineInterfaceExtensionObject *this,ScriptContext *scriptContext,
          JsBuiltInFile_conflict file)

{
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags implicitCallFlags;
  DisableImplicitFlags disableImplicitFlags;
  uint uVar3;
  BOOL BVar4;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody **ppFVar5;
  SRCINFO **ppSVar6;
  undefined4 *puVar7;
  JavascriptLibrary *pJVar8;
  ScriptFunction *this_00;
  RecyclableObject **ppRVar9;
  ThreadContext *pTVar10;
  ThreadContext *pTVar11;
  ParseableFunctionInfo *proxy;
  ScriptFunction *pSVar12;
  FunctionProxy *pFVar13;
  JavascriptException *err;
  Arguments local_100;
  ScriptFunction *local_f0;
  ScriptFunction *functionBuiltins;
  Arguments local_e0;
  undefined1 local_d0 [8];
  AutoRestoreImplicitFlags autoRestoreImplicitFlags;
  JsReentLock lock;
  CallInfo callInfo;
  Var args [2];
  AutoInitLibraryCodeScope autoInitLibraryCodeScope;
  ScriptFunction *functionGlobal;
  SRCINFO *hsi_2;
  uint32 flags_2;
  SRCINFO *hsi_1;
  uint32 flags_1;
  SRCINFO *hsi;
  FunctionBody *pFStack_30;
  uint32 flags;
  FunctionBody *jsBuiltInByteCode;
  JavascriptExceptionObject *pExceptionObject;
  JsBuiltInFile_conflict file_local;
  ScriptContext *scriptContext_local;
  JsBuiltInEngineInterfaceExtensionObject *this_local;
  
  pFStack_30 = (FunctionBody *)0x0;
  if (file == Array_prototype) {
    ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInArray_prototypeBytecode);
    if (*ppFVar5 != (FunctionBody *)0x0) {
      return;
    }
    EnsureSourceInfo(this);
    bVar2 = false;
    if ((DAT_01e9e300 & 1) != 0) {
      BVar4 = ScriptContext::IsProfiling(scriptContext);
      bVar2 = BVar4 == 0;
    }
    uVar3 = 0;
    if (bVar2) {
      uVar3 = 0x10000;
    }
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SRCINFO__
                        ((WriteBarrierPtr *)&this->sourceInfo);
    ByteCodeSerializer::DeserializeFromBuffer
              (scriptContext,uVar3 | 0x80000,(LPCUTF8)0x0,*ppSVar6,
               js::Library_Bytecode_Array_prototype,(NativeModule *)0x0,
               &this->jsBuiltInArray_prototypeBytecode,0xffffffff);
    ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInArray_prototypeBytecode);
    pFStack_30 = *ppFVar5;
  }
  else if (file == Math_object) {
    ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInMath_objectBytecode);
    if (*ppFVar5 != (FunctionBody *)0x0) {
      return;
    }
    EnsureSourceInfo(this);
    bVar2 = false;
    if ((DAT_01e9e300 & 1) != 0) {
      BVar4 = ScriptContext::IsProfiling(scriptContext);
      bVar2 = BVar4 == 0;
    }
    uVar3 = 0;
    if (bVar2) {
      uVar3 = 0x10000;
    }
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SRCINFO__
                        ((WriteBarrierPtr *)&this->sourceInfo);
    ByteCodeSerializer::DeserializeFromBuffer
              (scriptContext,uVar3 | 0x80000,(LPCUTF8)0x0,*ppSVar6,js::Library_Bytecode_Math_object,
               (NativeModule *)0x0,&this->jsBuiltInMath_objectBytecode,0xffffffff);
    ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInMath_objectBytecode);
    pFStack_30 = *ppFVar5;
  }
  else if (file == Object_constructor) {
    ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInObject_constructorBytecode);
    if (*ppFVar5 != (FunctionBody *)0x0) {
      return;
    }
    EnsureSourceInfo(this);
    bVar2 = false;
    if ((DAT_01e9e300 & 1) != 0) {
      BVar4 = ScriptContext::IsProfiling(scriptContext);
      bVar2 = BVar4 == 0;
    }
    uVar3 = 0;
    if (bVar2) {
      uVar3 = 0x10000;
    }
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SRCINFO__
                        ((WriteBarrierPtr *)&this->sourceInfo);
    ByteCodeSerializer::DeserializeFromBuffer
              (scriptContext,uVar3 | 0x80000,(LPCUTF8)0x0,*ppSVar6,
               js::Library_Bytecode_Object_constructor,(NativeModule *)0x0,
               &this->jsBuiltInObject_constructorBytecode,0xffffffff);
    ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInObject_constructorBytecode);
    pFStack_30 = *ppFVar5;
  }
  EngineExtensionObjectBase::SetHasBytecode(&this->super_EngineExtensionObjectBase);
  if (pFStack_30 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x68,"(jsBuiltInByteCode != nullptr)",
                                "jsBuiltInByteCode != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pJVar8 = ScriptContext::GetLibrary(scriptContext);
  this_00 = JavascriptLibrary::CreateScriptFunction(pJVar8,(FunctionProxy *)pFStack_30);
  pJVar8 = ScriptContext::GetLibrary(scriptContext);
  ppRVar9 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&(pJVar8->super_JavascriptLibraryBase).nullValue);
  (*(this_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x4b])(this_00,*ppRVar9);
  AutoInitLibraryCodeScope::AutoInitLibraryCodeScope
            ((AutoInitLibraryCodeScope *)(args + 1),scriptContext);
  pJVar8 = ScriptContext::GetLibrary(scriptContext);
  callInfo = (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar8->super_JavascriptLibraryBase);
  pJVar8 = ScriptContext::GetLibrary(scriptContext);
  args[0] = JavascriptLibraryBase::GetEngineInterfaceObject(&pJVar8->super_JavascriptLibraryBase);
  CallInfo::CallInfo((CallInfo *)&lock.m_savedNoJsReentrancy,CallFlags_Value,2);
  pTVar10 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&autoRestoreImplicitFlags.savedImplicitCallFlags,pTVar10);
  pTVar10 = ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::SetNoJsReentrancy(pTVar10,false);
  this->current = file;
  pTVar10 = ScriptContext::GetThreadContext(scriptContext);
  pTVar11 = ScriptContext::GetThreadContext(scriptContext);
  implicitCallFlags = ThreadContext::GetImplicitCallFlags(pTVar11);
  pTVar11 = ScriptContext::GetThreadContext(scriptContext);
  disableImplicitFlags = ThreadContext::GetDisableImplicitFlags(pTVar11);
  ThreadContext::AutoRestoreImplicitFlags::AutoRestoreImplicitFlags
            ((AutoRestoreImplicitFlags *)local_d0,pTVar10,implicitCallFlags,disableImplicitFlags);
  pTVar10 = ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::ClearDisableImplicitFlags(pTVar10);
  functionBuiltins = (ScriptFunction *)lock._24_8_;
  Arguments::Arguments(&local_e0,(CallInfo)lock._24_8_,(Var *)&callInfo);
  JavascriptFunction::CallRootFunctionInScript((JavascriptFunction *)this_00,&local_e0);
  pJVar8 = ScriptContext::GetLibrary(scriptContext);
  proxy = ParseableFunctionInfo::GetNestedFunctionForExecution
                    (&pFStack_30->super_ParseableFunctionInfo,0);
  pSVar12 = JavascriptLibrary::CreateScriptFunction(pJVar8,&proxy->super_FunctionProxy);
  local_f0 = pSVar12;
  pJVar8 = ScriptContext::GetLibrary(scriptContext);
  ppRVar9 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&(pJVar8->super_JavascriptLibraryBase).nullValue);
  (*(pSVar12->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x4b])(pSVar12,*ppRVar9);
  pSVar12 = local_f0;
  Arguments::Arguments(&local_100,(CallInfo)lock._24_8_,(Var *)&callInfo);
  JavascriptFunction::CallRootFunctionInScript((JavascriptFunction *)pSVar12,&local_100);
  ThreadContext::AutoRestoreImplicitFlags::~AutoRestoreImplicitFlags
            ((AutoRestoreImplicitFlags *)local_d0);
  if (file == Array_prototype) {
    InitializePrototypes(this,scriptContext);
  }
  pFVar13 = ScriptFunction::GetFunctionProxy(this_00);
  sourceContextId = FunctionProxy::GetSourceContextId(pFVar13);
  pFVar13 = ScriptFunction::GetFunctionProxy(this_00);
  functionId = FunctionProxy::GetLocalFunctionId(pFVar13);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ea1258,ByteCodePhase,sourceContextId,functionId);
  if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
    (*(this->super_EngineExtensionObjectBase)._vptr_EngineExtensionObjectBase[1])();
  }
  JsReentLock::~JsReentLock((JsReentLock *)&autoRestoreImplicitFlags.savedImplicitCallFlags);
  AutoInitLibraryCodeScope::~AutoInitLibraryCodeScope((AutoInitLibraryCodeScope *)(args + 1));
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::InjectJsBuiltInLibraryCode(ScriptContext * scriptContext, JsBuiltInFile file)
    {
        JavascriptExceptionObject *pExceptionObject = nullptr;
        FunctionBody* jsBuiltInByteCode = nullptr;

        switch (file)
        {
            #define jsBuiltInByteCodeCase(class, type, obj) \
            case (JsBuiltInFile::class##_##type): \
            { \
                if (jsBuiltIn##class##_##type##Bytecode != nullptr) \
                    return; \
                EnsureSourceInfo(); \
                uint32 flags = fscrJsBuiltIn | (CONFIG_FLAG(CreateFunctionProxy) && !scriptContext->IsProfiling() ? fscrAllowFunctionProxy : 0); \
                SRCINFO* hsi = sourceInfo; \
                Js::ByteCodeSerializer::DeserializeFromBuffer(scriptContext, flags, (LPCUTF8)nullptr, hsi, (byte*)js::Library_Bytecode_##class##_##type, nullptr, &jsBuiltIn##class##_##type##Bytecode); \
                jsBuiltInByteCode = jsBuiltIn##class##_##type##Bytecode; \
                break; \
            }
            JsBuiltIns(jsBuiltInByteCodeCase)
            #undef jsBuiltInByteCodeCase
        }
        this->SetHasBytecode();

        try {
            AssertOrFailFast(jsBuiltInByteCode != nullptr);

            Js::ScriptFunction *functionGlobal = scriptContext->GetLibrary()->CreateScriptFunction(jsBuiltInByteCode);

            // If we are in the debugger and doing a GetProperty of arguments, then Js Builtins code will be injected on-demand
            // Since it is a cross site call, we marshall not only functionGlobal but also its entire prototype chain
            // The prototype of functionGlobal will be shared by a normal Js function,
            // so marshalling will inadvertently transition the entrypoint of the prototype to a crosssite entrypoint
            // So we set the prototype to null here
            functionGlobal->SetPrototype(scriptContext->GetLibrary()->nullValue);

#ifdef ENABLE_SCRIPT_PROFILING
            // If we are profiling, we need to register the script to the profiler callback, so the script compiled event will be sent.
            if (scriptContext->IsProfiling())
            {
                scriptContext->RegisterScript(functionGlobal->GetFunctionProxy());
            }
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
            // Mark we are profiling library code already, so that any initialization library code called here won't be reported to profiler.
            // Also tell the debugger not to record events during intialization so that we don't leak information about initialization.
            AutoInitLibraryCodeScope autoInitLibraryCodeScope(scriptContext);
#endif

            Js::Var args[] = { scriptContext->GetLibrary()->GetUndefined(), scriptContext->GetLibrary()->GetEngineInterfaceObject() };
            Js::CallInfo callInfo(Js::CallFlags_Value, _countof(args));

#if ENABLE_JS_REENTRANCY_CHECK
            // Create a Reentrancy lock to make sure we correctly restore the lock at the end of BuiltIns initialization
            JsReentLock lock(scriptContext->GetThreadContext());
            // Clear ReentrancyLock bit as initialization code doesn't have any side effect
            scriptContext->GetThreadContext()->SetNoJsReentrancy(false);
#endif
            // specify which set of BuiltIns are currently being loaded
            current = file;

            // Clear disable implicit call bit as initialization code doesn't have any side effect
            {
                ThreadContext::AutoRestoreImplicitFlags autoRestoreImplicitFlags(scriptContext->GetThreadContext(), scriptContext->GetThreadContext()->GetImplicitCallFlags(), scriptContext->GetThreadContext()->GetDisableImplicitFlags());
                scriptContext->GetThreadContext()->ClearDisableImplicitFlags();
                JavascriptFunction::CallRootFunctionInScript(functionGlobal, Js::Arguments(callInfo, args));

                Js::ScriptFunction *functionBuiltins = scriptContext->GetLibrary()->CreateScriptFunction(jsBuiltInByteCode->GetNestedFunctionForExecution(0));
                functionBuiltins->SetPrototype(scriptContext->GetLibrary()->nullValue);
                JavascriptFunction::CallRootFunctionInScript(functionBuiltins, Js::Arguments(callInfo, args));
            }

            if (file == JsBuiltInFile::Array_prototype)
            {
                InitializePrototypes(scriptContext);
            }
#if DBG_DUMP
            if (PHASE_DUMP(Js::ByteCodePhase, functionGlobal->GetFunctionProxy()) && Js::Configuration::Global.flags.Verbose)
            {
                DumpByteCode();
            }
#endif
        }
        catch (const JavascriptException& err)
        {
            pExceptionObject = err.GetAndClear();
        }

        if (pExceptionObject)
        {
            switch (file)
            {
                #define clearJsBuiltInByteCodeCase(class, type, obj) \
            case (JsBuiltInFile::class##_##type): \
                jsBuiltIn##class##_##type##Bytecode = nullptr;
                    break;
            JsBuiltIns(clearJsBuiltInByteCodeCase)
            #undef clearJsBuiltInByteCodeCase
            }
            jsBuiltInByteCode = nullptr;
            if (pExceptionObject == ThreadContext::GetContextForCurrentThread()->GetPendingSOErrorObject())
            {
                JavascriptExceptionOperators::DoThrowCheckClone(pExceptionObject, scriptContext);
            }
            Js::Throw::FatalJsBuiltInError();
        }
    }